

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerApp.cpp
# Opt level: O0

string * __thiscall helics::BrokerApp::getAddress_abi_cxx11_(BrokerApp *this)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  __shared_ptr *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  string *local_18;
  
  if (getAddress[abi:cxx11]()::estring_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&getAddress[abi:cxx11]()::estring_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::string::string(unaff_retaddr);
      __cxa_atexit(std::__cxx11::string::~string,&getAddress[abi:cxx11]()::estring_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&getAddress[abi:cxx11]()::estring_abi_cxx11_);
    }
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RDI);
  if (bVar1) {
    peVar3 = CLI::std::__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<helics::Broker,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x421049);
    iVar2 = (*peVar3->_vptr_Broker[0xc])();
    local_18 = (string *)CONCAT44(extraout_var,iVar2);
  }
  else {
    local_18 = &getAddress[abi:cxx11]()::estring_abi_cxx11_;
  }
  return local_18;
}

Assistant:

const std::string& BrokerApp::getAddress() const
{
    static const std::string estring;
    return (broker) ? broker->getAddress() : estring;
}